

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::WriteDeltaFor
               (hugeint_t *values,bool *validity,bitpacking_width_t width,
               hugeint_t frame_of_reference,hugeint_t delta_offset,hugeint_t *original_values,
               idx_t count,void *data_ptr)

{
  idx_t iVar1;
  BitpackingWriter *this;
  data_ptr_t *in_RCX;
  data_ptr_t *ppdVar2;
  uint64_t in_R8;
  hugeint_t val;
  hugeint_t val_00;
  hugeint_t val_01;
  long in_stack_00000020;
  idx_t bp_size;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *state;
  bitpacking_width_t in_stack_000001af;
  idx_t in_stack_000001b0;
  hugeint_t *in_stack_000001b8;
  data_ptr_t in_stack_000001c0;
  undefined7 in_stack_ffffffffffffff78;
  bitpacking_width_t in_stack_ffffffffffffff7f;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *in_stack_ffffffffffffff80;
  undefined8 *value;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *in_stack_ffffffffffffff90;
  uint64_t count_00;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *in_stack_ffffffffffffffa0;
  uint64_t local_58;
  
  value = (undefined8 *)&stack0x00000008;
  ppdVar2 = in_RCX;
  iVar1 = BitpackingPrimitives::GetRequiredSize
                    ((idx_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  ReserveSpace(in_stack_ffffffffffffff80,
               CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  WriteMetaData(in_stack_ffffffffffffff90,(BitpackingMode)((ulong)value >> 0x38));
  val.upper = (int64_t)ppdVar2;
  val.lower = in_R8;
  WriteData<duckdb::hugeint_t>((BitpackingWriter *)(in_stack_00000020 + 0x40),in_RCX,val);
  this = (BitpackingWriter *)(in_stack_00000020 + 0x40);
  hugeint_t::hugeint_t((hugeint_t *)in_stack_ffffffffffffff90,(int64_t)value);
  val_00.upper = (int64_t)ppdVar2;
  val_00.lower = local_58;
  WriteData<duckdb::hugeint_t>(this,(data_ptr_t *)in_stack_ffffffffffffffa0,val_00);
  count_00 = value[1];
  val_01.upper = (int64_t)*value;
  val_01.lower = count_00;
  WriteData<duckdb::hugeint_t>
            ((BitpackingWriter *)(in_stack_00000020 + 0x40),(data_ptr_t *)*value,val_01);
  BitpackingPrimitives::PackBuffer<duckdb::hugeint_t,false>
            (in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001af);
  *(idx_t *)(in_stack_00000020 + 0x40) = iVar1 + *(long *)(in_stack_00000020 + 0x40);
  UpdateStats(in_stack_ffffffffffffffa0,count_00);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}